

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonwriter.cpp
# Opt level: O1

void QJsonPrivate::Writer::valueToJson(QCborValue *v,QByteArray *json,int indent,bool compact)

{
  ArrayOptions *pAVar1;
  Data *pDVar2;
  long lVar3;
  
  if (v->container == (QCborContainerPrivate *)0x0) {
    lVar3 = 0x10;
  }
  else {
    lVar3 = (v->container->elements).d.size;
  }
  lVar3 = lVar3 + (json->d).size;
  pDVar2 = (json->d).d;
  if (((pDVar2 == (Data *)0x0) ||
      (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((long)((((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0) +
             (pDVar2->super_QArrayData).alloc) - (long)(json->d).ptr) < lVar3)) {
    QByteArray::reallocData(json,lVar3,KeepSize);
  }
  pDVar2 = (json->d).d;
  if ((pDVar2 != (Data *)0x0) && ((pDVar2->super_QArrayData).alloc != 0)) {
    pAVar1 = &(pDVar2->super_QArrayData).flags;
    *(byte *)&(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
              super_QFlagsStorage<QArrayData::ArrayOption>.i =
         (byte)(pAVar1->super_QFlagsStorageHelper<QArrayData::ArrayOption,_4>).
               super_QFlagsStorage<QArrayData::ArrayOption>.i | 1;
  }
  valueContentToJson(v,json,indent,compact);
  if ((!compact) && ((v->t | 0x20) == Map)) {
    QByteArray::append(json,'\n');
    return;
  }
  return;
}

Assistant:

void Writer::valueToJson(const QCborValue &v, QByteArray &json, int indent, bool compact)
{
    const QCborContainerPrivate *container = QJsonPrivate::Value::container(v);
    json.reserve(json.size() + (container ? container->elements.size() : 16));
    valueContentToJson(v, json, indent, compact);

    if (!compact && (v.isMap() || v.isArray())) {
        json.append('\n');
    }
}